

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExpressionCoverageBinInitializerSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionCoverageBinInitializerSyntax,slang::syntax::ExpressionCoverageBinInitializerSyntax_const&>
          (BumpAllocator *this,ExpressionCoverageBinInitializerSyntax *args)

{
  ExpressionCoverageBinInitializerSyntax *pEVar1;
  undefined8 *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pEVar1 = (ExpressionCoverageBinInitializerSyntax *)
           allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  *(undefined8 *)&(pEVar1->super_CoverageBinInitializerSyntax).super_SyntaxNode = *in_RSI;
  (pEVar1->super_CoverageBinInitializerSyntax).super_SyntaxNode.parent = (SyntaxNode *)in_RSI[1];
  (pEVar1->super_CoverageBinInitializerSyntax).super_SyntaxNode.previewNode =
       (SyntaxNode *)in_RSI[2];
  (pEVar1->expr).ptr = (ExpressionSyntax *)in_RSI[3];
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }